

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void do_test_record_receipt(size_t epoch)

{
  int iVar1;
  st_quicly_pn_space_t *space;
  undefined8 uVar2;
  uint64_t uVar3;
  ulong uVar4;
  bool bVar5;
  int64_t send_ack_at;
  ulong local_58;
  uint64_t local_50;
  ulong local_48;
  uint64_t local_40;
  size_t local_38;
  
  space = (st_quicly_pn_space_t *)malloc(0x48);
  if (space == (st_quicly_pn_space_t *)0x0) {
    space = (st_quicly_pn_space_t *)0x0;
  }
  else {
    (space->ack_queue).ranges = &(space->ack_queue)._initial;
    (space->ack_queue).num_ranges = 0;
    (space->ack_queue).capacity = 1;
    space->largest_pn_received_at = 0x7fffffffffffffff;
    space->next_expected_packet_number = 0;
    space->unacked_count = 0;
    space->packet_tolerance = (epoch == 3) + 1;
    space->ignore_order = '\0';
  }
  local_58 = 0x7fffffffffffffff;
  iVar1 = record_receipt(space,0,0,0x3039,(int64_t *)&local_58);
  local_38 = epoch;
  if (epoch == 3) {
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1ba);
    _ok((uint)(local_58 == 0x3052),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1bb);
    iVar1 = record_receipt(space,1,0,0x303a,(int64_t *)&local_58);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1bd);
    bVar5 = local_58 == 0x303a;
    local_48 = 0x303b;
    local_40 = 2;
    uVar2 = 0x1be;
  }
  else {
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1c2);
    bVar5 = local_58 == 0x3039;
    local_48 = 0x303a;
    local_40 = 1;
    uVar2 = 0x1c3;
  }
  _ok((uint)bVar5,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",uVar2)
  ;
  uVar3 = local_40;
  uVar4 = local_48;
  space->unacked_count = 0;
  local_58 = 0x7fffffffffffffff;
  local_50 = local_40 + 1;
  iVar1 = record_receipt(space,local_40,1,local_48,(int64_t *)&local_58);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cc)
  ;
  _ok((uint)(local_58 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cd)
  ;
  iVar1 = record_receipt(space,local_50,1,uVar4 + 1,(int64_t *)&local_58);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cf)
  ;
  _ok((uint)(local_58 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d0)
  ;
  local_50 = uVar3 + 4;
  iVar1 = record_receipt(space,uVar3 + 3,1,uVar4 + 2,(int64_t *)&local_58);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d3)
  ;
  _ok((uint)(local_58 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d4)
  ;
  iVar1 = record_receipt(space,local_50,1,uVar4 + 3,(int64_t *)&local_58);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d6)
  ;
  _ok((uint)(local_58 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d7)
  ;
  iVar1 = record_receipt(space,uVar3 + 6,0,uVar4 | 4,(int64_t *)&local_58);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1dc)
  ;
  _ok((uint)(local_58 == (uVar4 | 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1dd)
  ;
  uVar4 = local_48;
  space->unacked_count = 0;
  local_58 = 0x7fffffffffffffff;
  if (local_38 == 3) {
    space->ignore_order = '\x01';
    uVar3 = local_40 + 9;
    iVar1 = record_receipt(space,local_40 + 8,0,local_48 + 5,(int64_t *)&local_58);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1e8);
    _ok((uint)(local_58 == uVar4 + 0x1e),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1e9);
    uVar4 = uVar4 + 6;
    iVar1 = record_receipt(space,uVar3,0,uVar4,(int64_t *)&local_58);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1eb);
    _ok((uint)(local_58 == uVar4),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1ec);
  }
  do_free_pn_space(space);
  return;
}

Assistant:

static void do_test_record_receipt(size_t epoch)
{
    struct st_quicly_pn_space_t *space =
        alloc_pn_space(sizeof(*space), epoch == QUICLY_EPOCH_1RTT ? QUICLY_DEFAULT_PACKET_TOLERANCE : 1);
    uint64_t pn = 0;
    int64_t now = 12345, send_ack_at = INT64_MAX;

    if (epoch == QUICLY_EPOCH_1RTT) {
        /* 2nd packet triggers an ack */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now + QUICLY_DELAYED_ACK_TIMEOUT);
        now += 1;
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    } else {
        /* every packet triggers an ack */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    }

    /* reset */
    space->unacked_count = 0;
    send_ack_at = INT64_MAX;

    /* ack-only packets do not elicit an ack */
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    pn++; /* gap */
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;

    /* gap triggers an ack */
    pn += 1; /* gap */
    ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
    ok(send_ack_at == now);
    now += 1;

    /* reset */
    space->unacked_count = 0;
    send_ack_at = INT64_MAX;

    /* if 1-RTT, test ignore-order */
    if (epoch == QUICLY_EPOCH_1RTT) {
        space->ignore_order = 1;
        pn++; /* gap */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now + QUICLY_DELAYED_ACK_TIMEOUT);
        now += 1;
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    }

    do_free_pn_space(space);
}